

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtpaths.cpp
# Opt level: O3

QString * searchStringOrError(QString *__return_storage_ptr__,QCommandLineParser *parser)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_40;
  QString *local_28;
  
  local_28 = *(QString **)(in_FS_OFFSET + 0x28);
  QCommandLineParser::positionalArguments();
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_40);
  if ((int)local_40.size != 1) {
    local_40.d = (Data *)0x0;
    local_40.ptr = (QString *)0x112c08;
    local_40.size = 0x29;
    error((QString *)&local_40);
  }
  QCommandLineParser::positionalArguments();
  pDVar1 = ((local_40.ptr)->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = ((local_40.ptr)->d).ptr;
  (__return_storage_ptr__->d).size = ((local_40.ptr)->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_40);
  if (*(QString **)(in_FS_OFFSET + 0x28) == local_28) {
    return *(QString **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QString searchStringOrError(QCommandLineParser *parser)
{
    int positionalArgumentCount = parser->positionalArguments().size();
    if (positionalArgumentCount != 1)
        error(QStringLiteral("Exactly one argument needed as searchitem"));
    return parser->positionalArguments().constFirst();
}